

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

int __thiscall
QFusionStyle::pixelMetric
          (QFusionStyle *this,PixelMetric metric,QStyleOption *option,QWidget *widget)

{
  int iVar1;
  QStyle *pQVar2;
  qreal qVar3;
  
  iVar1 = -1;
  qVar3 = 4.0;
  switch(metric) {
  case PM_ButtonMargin:
  case PM_MenuBarItemSpacing:
    qVar3 = 6.0;
    break;
  default:
    iVar1 = QCommonStyle::pixelMetric(&this->super_QCommonStyle,metric,option,widget);
    return iVar1;
  case PM_DefaultFrameWidth:
    return 1;
  case PM_SpinBoxFrameWidth:
    qVar3 = 3.0;
    break;
  case PM_MaximumDragDistance:
    goto switchD_003978b4_caseD_8;
  case PM_ScrollBarExtent:
  case PM_IndicatorWidth:
  case PM_IndicatorHeight:
  case PM_ExclusiveIndicatorWidth:
  case PM_ExclusiveIndicatorHeight:
    qVar3 = 14.0;
    break;
  case PM_ScrollBarSliderMin:
    qVar3 = 26.0;
    break;
  case PM_SliderThickness:
  case PM_SliderLength:
    qVar3 = 15.0;
    break;
  case PM_SliderTickmarkOffset:
  case PM_DockWidgetHandleExtent:
  case PM_SplitterWidth:
    break;
  case PM_TabBarTabOverlap:
  case PM_ToolBarItemSpacing:
  case PM_DockWidgetTitleMargin:
    qVar3 = 1.0;
    break;
  case PM_TabBarTabVSpace:
    qVar3 = 12.0;
    break;
  case PM_TabBarBaseOverlap:
  case PM_HeaderMargin:
  case PM_ToolBarFrameWidth:
  case PM_ToolBarItemMargin:
  case PM_ToolTipLabelFrameWidth:
  case PM_DockWidgetTitleBarButtonMargin:
    qVar3 = 2.0;
    break;
  case PM_TitleBarHeight:
  case PM_ListViewIconSize:
    qVar3 = 24.0;
    break;
  case PM_ToolBarHandleExtent:
    qVar3 = 9.0;
    break;
  case PM_SmallIconSize:
  case PM_ButtonIconSize:
    qVar3 = 16.0;
    break;
  case PM_MessageBoxIconSize:
    qVar3 = 48.0;
    break;
  case PM_TabCloseIndicatorWidth:
  case PM_TabCloseIndicatorHeight:
    qVar3 = 20.0;
    break;
  case PM_ScrollView_ScrollBarOverlap:
    pQVar2 = QStyle::proxy((QStyle *)0xffffffffffffffff);
    pQVar2 = (QStyle *)(**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x60,option,widget,0);
    if ((int)pQVar2 != 0) {
      pQVar2 = QStyle::proxy(pQVar2);
      iVar1 = (**(code **)(*(long *)pQVar2 + 0xe0))
                        (pQVar2,9,option,widget,*(code **)(*(long *)pQVar2 + 0xe0));
      return iVar1;
    }
  case PM_ButtonDefaultIndicator:
  case PM_ButtonShiftHorizontal:
  case PM_ButtonShiftVertical:
  case PM_MenuHMargin:
  case PM_MenuVMargin:
  case PM_MenuPanelWidth:
  case PM_MenuBarPanelWidth:
  case PM_MenuBarVMargin:
  case PM_MenuBarHMargin:
  case PM_ScrollView_ScrollBarSpacing:
    qVar3 = 0.0;
    break;
  case PM_SubMenuOverlap:
    qVar3 = -1.0;
    break;
  case PM_TitleBarButtonSize:
    qVar3 = 19.0;
  }
  qVar3 = QStyleHelper::dpiScaled(qVar3,option);
  iVar1 = (int)qVar3;
switchD_003978b4_caseD_8:
  return iVar1;
}

Assistant:

int QFusionStyle::pixelMetric(PixelMetric metric, const QStyleOption *option, const QWidget *widget) const
{
    int val = -1;
    switch (metric) {
    case PM_SliderTickmarkOffset:
        val = 4;
        break;
    case PM_HeaderMargin:
    case PM_ToolTipLabelFrameWidth:
        val = 2;
        break;
    case PM_ButtonDefaultIndicator:
    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:
        val = 0;
        break;
    case PM_MessageBoxIconSize:
        val = 48;
        break;
    case PM_ListViewIconSize:
        val = 24;
        break;
    case PM_ScrollBarSliderMin:
        val = 26;
        break;
    case PM_TitleBarHeight:
        val = 24;
        break;
    case PM_ScrollBarExtent:
        val = 14;
        break;
    case PM_SliderThickness:
    case PM_SliderLength:
        val = 15;
        break;
    case PM_DockWidgetTitleMargin:
        val = 1;
        break;
    case PM_SpinBoxFrameWidth:
        val = 3;
        break;
    case PM_MenuVMargin:
    case PM_MenuHMargin:
    case PM_MenuPanelWidth:
        val = 0;
        break;
    case PM_MenuBarItemSpacing:
        val = 6;
        break;
    case PM_MenuBarVMargin:
    case PM_MenuBarHMargin:
    case PM_MenuBarPanelWidth:
        val = 0;
        break;
    case PM_ToolBarHandleExtent:
        val = 9;
        break;
    case PM_ToolBarItemSpacing:
        val = 1;
        break;
    case PM_ToolBarFrameWidth:
    case PM_ToolBarItemMargin:
        val = 2;
        break;
    case PM_SmallIconSize:
    case PM_ButtonIconSize:
        val = 16;
        break;
    case PM_DockWidgetTitleBarButtonMargin:
        val = 2;
        break;
    case PM_ButtonMargin:
        val = 6;
        break;
    case PM_TitleBarButtonSize:
        val = 19;
        break;
    case PM_MaximumDragDistance:
        return -1; // Do not dpi-scale because the value is magic
    case PM_TabCloseIndicatorWidth:
    case PM_TabCloseIndicatorHeight:
        val = 20;
        break;
    case PM_TabBarTabVSpace:
        val = 12;
        break;
    case PM_TabBarTabOverlap:
        val = 1;
        break;
    case PM_TabBarBaseOverlap:
        val = 2;
        break;
    case PM_SubMenuOverlap:
        val = -1;
        break;
    case PM_DockWidgetHandleExtent:
    case PM_SplitterWidth:
        val = 4;
        break;
    case PM_IndicatorHeight:
    case PM_IndicatorWidth:
    case PM_ExclusiveIndicatorHeight:
    case PM_ExclusiveIndicatorWidth:
        val = 14;
        break;
    case PM_ScrollView_ScrollBarSpacing:
        val = 0;
        break;
    case PM_ScrollView_ScrollBarOverlap:
        if (proxy()->styleHint(SH_ScrollBar_Transient, option, widget))
            return proxy()->pixelMetric(PM_ScrollBarExtent, option, widget);
        val = 0;
        break;
    case PM_DefaultFrameWidth:
        return 1; // Do not dpi-scale because the drawn frame is always exactly 1 pixel thick
    default:
        return QCommonStyle::pixelMetric(metric, option, widget);
    }
    return QStyleHelper::dpiScaled(val, option);
}